

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O0

Real __thiscall Omega_h::Mesh::imbalance(Mesh *this,Int ent_dim)

{
  LO LVar1;
  I32 IVar2;
  element_type *peVar3;
  double dVar4;
  double dVar5;
  double a;
  I32 n;
  double m;
  double s;
  Real local;
  Int ent_dim_local;
  Mesh *this_local;
  
  local._4_4_ = ent_dim;
  if (ent_dim == -1) {
    local._4_4_ = dim(this);
  }
  LVar1 = nents(this,local._4_4_);
  peVar3 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->comm_);
  dVar4 = Comm::allreduce<double>(peVar3,(double)LVar1,OMEGA_H_SUM);
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    peVar3 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->comm_);
    dVar5 = Comm::allreduce<double>(peVar3,(double)LVar1,OMEGA_H_MAX);
    peVar3 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->comm_);
    IVar2 = Comm::size(peVar3);
    this_local = (Mesh *)(dVar5 / (dVar4 / (double)IVar2));
  }
  else {
    this_local = (Mesh *)0x3ff0000000000000;
  }
  return (Real)this_local;
}

Assistant:

Real Mesh::imbalance(Int ent_dim) const {
  if (ent_dim == -1) ent_dim = dim();
  auto local = Real(nents(ent_dim));
  auto s = comm_->allreduce(local, OMEGA_H_SUM);
  if (s == 0.0) return 1.0;
  auto m = comm_->allreduce(local, OMEGA_H_MAX);
  auto n = comm_->size();
  auto a = s / n;
  return m / a;
}